

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_test.cpp
# Opt level: O2

void __thiscall
FloatingPoint_NextUpDownDouble_Test::TestBody(FloatingPoint_NextUpDownDouble_Test *this)

{
  bool bVar1;
  double dVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  byte bVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  int iVar10;
  AssertHelper local_80;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar;
  AssertHelper local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_80.data_ = (AssertHelperData *)0x0;
  gtest_ar_6.success_ = true;
  gtest_ar_6._1_7_ = 0;
  testing::internal::CmpHelperGT<double,double>
            ((internal *)&gtest_ar,"NextFloatUp(-0.)","0.",(double *)&gtest_ar_6,(double *)&local_80
            );
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/float_test.cpp"
               ,0x43,pcVar9);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_6);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_80.data_ = (AssertHelperData *)0x0;
  gtest_ar_6.success_ = true;
  gtest_ar_6._1_7_ = 0x80000000000000;
  testing::internal::CmpHelperLT<double,double>
            ((internal *)&gtest_ar,"NextFloatDown(0.)","0.",(double *)&gtest_ar_6,
             (double *)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/float_test.cpp"
               ,0x44,pcVar9);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_6);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_6.success_ = false;
  gtest_ar_6._1_7_ = 0x7ff00000000000;
  local_80.data_ = (AssertHelperData *)0x7ff0000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"NextFloatUp((double)Infinity)","(double)Infinity",
             (double *)&gtest_ar_6,(double *)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/float_test.cpp"
               ,0x46,pcVar9);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_6);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_80.data_ = (AssertHelperData *)0x7ff0000000000000;
  gtest_ar_6.success_ = true;
  gtest_ar_6._1_7_ = 0x7fefffffffffff;
  testing::internal::CmpHelperLT<double,double>
            ((internal *)&gtest_ar,"NextFloatDown((double)Infinity)","(double)Infinity",
             (double *)&gtest_ar_6,(double *)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/float_test.cpp"
               ,0x47,pcVar9);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_6);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_6.success_ = false;
  gtest_ar_6._1_7_ = 0xfff00000000000;
  local_80.data_ = (AssertHelperData *)0xfff0000000000000;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"NextFloatDown(-(double)Infinity)","-(double)Infinity",
             (double *)&gtest_ar_6,(double *)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/float_test.cpp"
               ,0x49,pcVar9);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_6);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_6.success_ = true;
  gtest_ar_6._1_7_ = 0xffefffffffffff;
  local_80.data_ = (AssertHelperData *)0xfff0000000000000;
  testing::internal::CmpHelperGT<double,double>
            ((internal *)&gtest_ar,"NextFloatUp(-(double)Infinity)","-(double)Infinity",
             (double *)&gtest_ar_6,(double *)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/float_test.cpp"
               ,0x4a,pcVar9);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_6);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  pbrt::RNG::SetSequence((RNG *)&gtest_ar,3);
  for (iVar10 = 0; iVar10 != 100000; iVar10 = iVar10 + 1) {
    do {
      uVar7 = (uint)((ulong)gtest_ar._0_8_ >> 0x2d) ^ (uint)((ulong)gtest_ar._0_8_ >> 0x1b);
      bVar5 = (byte)((ulong)gtest_ar._0_8_ >> 0x3b);
      uVar6 = gtest_ar._0_8_ * 0x5851f42d4c957f2d + (long)gtest_ar.message_.ptr_;
      uVar8 = (uint)(uVar6 >> 0x2d) ^ (uint)(uVar6 >> 0x1b);
      bVar3 = (byte)(uVar6 >> 0x3b);
      gtest_ar._0_8_ = uVar6 * 0x5851f42d4c957f2d + (long)gtest_ar.message_.ptr_;
      local_48 = (double)CONCAT44(uVar8 >> bVar3 | uVar8 << 0x20 - bVar3,
                                  uVar7 >> bVar5 | uVar7 << 0x20 - bVar5);
    } while (NAN(local_48));
    if (ABS(local_48) != INFINITY) {
      uStack_40 = 0;
      local_80.data_ = (AssertHelperData *)nextafter(local_48,INFINITY);
      auVar4._8_8_ = uStack_40;
      auVar4._0_8_ = local_48;
      uVar6 = vcmpsd_avx512f(auVar4,ZEXT816(0) << 0x40,0);
      bVar1 = SUB81(uVar6 & 1,0);
      dVar2 = (double)((ulong)!bVar1 * (long)local_48);
      local_50.data_ = (AssertHelperData *)((-(ulong)(dVar2 < 0.0) | 1) + (long)dVar2);
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)&gtest_ar_6,"std::nextafter(d, (double)Infinity)","NextFloatUp(d)",
                 (double *)&local_80,(double *)&local_50);
      if (gtest_ar_6.success_ == false) {
        testing::Message::Message((Message *)&local_80);
        pcVar9 = "";
        if (gtest_ar_6.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = ((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/float_test.cpp"
                   ,0x52,pcVar9);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_80);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_6.message_);
      local_80.data_ = (AssertHelperData *)nextafter(local_48,-INFINITY);
      dVar2 = (double)((uVar6 & 1) * -0x8000000000000000 + (ulong)!bVar1 * (long)local_48);
      local_50.data_ = (AssertHelperData *)((long)dVar2 + -1 + (ulong)(dVar2 <= 0.0) * 2);
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)&gtest_ar_6,"std::nextafter(d, -(double)Infinity)","NextFloatDown(d)",
                 (double *)&local_80,(double *)&local_50);
      if (gtest_ar_6.success_ == false) {
        testing::Message::Message((Message *)&local_80);
        pcVar9 = "";
        if (gtest_ar_6.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = ((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/float_test.cpp"
                   ,0x53,pcVar9);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_80);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_6.message_);
    }
  }
  return;
}

Assistant:

TEST(FloatingPoint, NextUpDownDouble) {
    EXPECT_GT(NextFloatUp(-0.), 0.);
    EXPECT_LT(NextFloatDown(0.), 0.);

    EXPECT_EQ(NextFloatUp((double)Infinity), (double)Infinity);
    EXPECT_LT(NextFloatDown((double)Infinity), (double)Infinity);

    EXPECT_EQ(NextFloatDown(-(double)Infinity), -(double)Infinity);
    EXPECT_GT(NextFloatUp(-(double)Infinity), -(double)Infinity);

    RNG rng(3);
    for (int i = 0; i < 100000; ++i) {
        double d = GetDouble(rng);
        if (std::isinf(d))
            continue;

        EXPECT_EQ(std::nextafter(d, (double)Infinity), NextFloatUp(d));
        EXPECT_EQ(std::nextafter(d, -(double)Infinity), NextFloatDown(d));
    }
}